

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.h
# Opt level: O3

T __thiscall
util::Result<result_tests::NoCopy>::value_or<int>
          (Result<result_tests::NoCopy> *this,int *default_value)

{
  int iVar1;
  long lVar2;
  T *pTVar3;
  _Head_base<0UL,_int_*,_false> _Var4;
  int *in_RDX;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if ((char)default_value[0x10] == '\x01') {
    pTVar3 = value((Result<result_tests::NoCopy> *)default_value);
    _Var4._M_head_impl =
         (pTVar3->m_n)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
         super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
         super__Head_base<0UL,_int_*,_false>._M_head_impl;
    (pTVar3->m_n)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl = (int *)0x0;
  }
  else {
    iVar1 = *in_RDX;
    _Var4._M_head_impl = (int *)operator_new(4);
    *_Var4._M_head_impl = iVar1;
  }
  *(int **)&(this->m_variant).super__Variant_base<bilingual_str,_result_tests::NoCopy>.
            super__Move_assign_alias<bilingual_str,_result_tests::NoCopy>.
            super__Copy_assign_alias<bilingual_str,_result_tests::NoCopy>.
            super__Move_ctor_alias<bilingual_str,_result_tests::NoCopy>.
            super__Copy_ctor_alias<bilingual_str,_result_tests::NoCopy>.
            super__Variant_storage_alias<bilingual_str,_result_tests::NoCopy> = _Var4._M_head_impl;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (unique_ptr<int,_std::default_delete<int>_>)
           (unique_ptr<int,_std::default_delete<int>_>)this;
  }
  __stack_chk_fail();
}

Assistant:

T value_or(U&& default_value) &&
    {
        return has_value() ? std::move(value()) : std::forward<U>(default_value);
    }